

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_mmi(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint uVar1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i64 pTVar4;
  uint uVar5;
  uintptr_t o;
  TCGv_i64 pTVar6;
  uintptr_t o_6;
  uint reg;
  uintptr_t o_9;
  uintptr_t o_4;
  TCGOpcode TVar7;
  TCGContext_conflict6 *tcg_ctx;
  uint rt;
  uintptr_t o_3;
  uint uVar8;
  uintptr_t o_2;
  TCGv_i64 pTVar9;
  uint rs;
  uintptr_t o_5;
  TCGv_i64 pTVar10;
  
  uVar1 = (uint)(env->active_tc).gpr[7];
  uVar8 = uVar1 & 0xfc00003f;
  if (0x29 < uVar8 + 0x90000000) {
switchD_00999f53_caseD_70000002:
    generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    return;
  }
  rs = uVar1 >> 0x15 & 0x1f;
  rt = uVar1 >> 0x10 & 0x1f;
  reg = uVar1 >> 0xb & 0x1f;
  switch(uVar8) {
  case 0x70000000:
  case 0x70000001:
  case 0x70000018:
  case 0x70000019:
  case 0x70000020:
  case 0x70000021:
    gen_mul_txx9((DisasContext_conflict6 *)env,uVar8,reg,rs,rt);
    return;
  default:
    goto switchD_00999f53_caseD_70000002;
  case 0x70000009:
    uVar8 = (uVar1 & 0xfc0007ff) + 0x8ffffff7;
    uVar1 = uVar8 >> 6;
    uVar8 = uVar8 * 0x4000000 | uVar1;
    if (((0x1f < uVar8) || ((0xfc3f371dU >> (uVar1 & 0x1f) & 1) != 0)) || (uVar8 != 0xe))
    goto switchD_00999f53_caseD_70000002;
    if (reg == 0) {
      return;
    }
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    if (rs == 0) {
      TVar7 = INDEX_op_movi_i64;
      pTVar4 = (TCGv_i64)0x0;
LAB_0099a678:
      tcg_gen_op2_mips64el
                (tcg_ctx,TVar7,(TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_mmr[reg]),
                 (TCGArg)pTVar4);
    }
    else if (tcg_ctx->cpu_mmr[reg] != tcg_ctx->cpu_gpr[rs]) {
      pTVar4 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rs]);
      TVar7 = INDEX_op_mov_i64;
      goto LAB_0099a678;
    }
    if (rt != 0) {
      if (reg == rt) {
        return;
      }
      pTVar4 = tcg_ctx->cpu_gpr[reg];
      pTVar10 = tcg_ctx->cpu_gpr[rt];
LAB_0099a697:
      if (pTVar4 == pTVar10) {
        return;
      }
      pTVar4 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)pTVar4);
      pTVar10 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)pTVar10);
      TVar7 = INDEX_op_mov_i64;
      goto LAB_0099a6d0;
    }
    pTVar4 = tcg_ctx->cpu_gpr[reg];
    break;
  case 0x70000010:
  case 0x70000012:
    goto LAB_00999fb0;
  case 0x70000011:
  case 0x70000013:
    reg = rs;
LAB_00999fb0:
    gen_HILO1_tx79((DisasContext_conflict6 *)env,uVar8,reg);
    return;
  case 0x7000001a:
  case 0x7000001b:
    tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    pTVar2 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
    pTVar3 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
    if (rs == 0) {
      TVar7 = INDEX_op_movi_i64;
      pTVar10 = (TCGv_i64)0x0;
LAB_0099a32a:
      tcg_gen_op2_mips64el(tcg_ctx,TVar7,(TCGArg)pTVar2,(TCGArg)pTVar10);
    }
    else if (tcg_ctx->cpu_gpr[rs] != pTVar4) {
      pTVar10 = tcg_ctx->cpu_gpr[rs] + (long)tcg_ctx;
      TVar7 = INDEX_op_mov_i64;
      goto LAB_0099a32a;
    }
    pTVar10 = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx);
    if (rt == 0) {
      TVar7 = INDEX_op_movi_i64;
      pTVar6 = (TCGv_i64)0x0;
LAB_0099a364:
      tcg_gen_op2_mips64el(tcg_ctx,TVar7,(TCGArg)pTVar3,(TCGArg)pTVar6);
    }
    else if (tcg_ctx->cpu_gpr[rt] != pTVar10) {
      pTVar6 = tcg_ctx->cpu_gpr[rt] + (long)tcg_ctx;
      TVar7 = INDEX_op_mov_i64;
      goto LAB_0099a364;
    }
    if (uVar8 == 0x7000001a) {
      pTVar2 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
      pTVar6 = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
      pTVar3 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
      pTVar9 = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar4,pTVar4);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar10,pTVar10);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar6,pTVar4,-0x80000000);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar9,pTVar10,-1);
      tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_and_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar9,pTVar10,0);
      tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
      tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)pTVar3,0);
      tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_NE,pTVar10,pTVar6,pTVar9,pTVar6,pTVar10);
      tcg_gen_div_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[1],pTVar4,pTVar10);
      tcg_gen_rem_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[1],pTVar4,pTVar10);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[1],tcg_ctx->cpu_LO[1]);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[1],tcg_ctx->cpu_HI[1]);
      tcg_temp_free_internal_mips64el(tcg_ctx,pTVar3);
    }
    else {
      pTVar6 = tcg_const_i64_mips64el(tcg_ctx,0);
      pTVar9 = tcg_const_i64_mips64el(tcg_ctx,1);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,pTVar4,pTVar4);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,pTVar10,pTVar10);
      tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,pTVar10,pTVar10,pTVar6,pTVar9,pTVar10);
      tcg_gen_divu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[1],pTVar4,pTVar10);
      tcg_gen_remu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[1],pTVar4,pTVar10);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[1],tcg_ctx->cpu_LO[1]);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[1],tcg_ctx->cpu_HI[1]);
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar9 + (long)tcg_ctx));
      pTVar2 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,pTVar2);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    pTVar2 = (TCGTemp *)(pTVar10 + (long)tcg_ctx);
LAB_0099a5ad:
    tcg_temp_free_internal_mips64el(tcg_ctx,pTVar2);
    return;
  case 0x70000029:
    uVar5 = (uVar1 & 0xfc0007ff) + 0x8fffffd7;
    uVar8 = uVar5 >> 6;
    uVar5 = uVar5 * 0x4000000 | uVar8;
    if ((0x1e < uVar5) || ((0x440c3709U >> (uVar8 & 0x1f) & 1) != 0))
    goto switchD_00999f53_caseD_70000002;
    if (uVar5 == 0xe) {
      if (reg == 0) {
        return;
      }
      tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      if (rs == 0) {
        TVar7 = INDEX_op_movi_i64;
        pTVar4 = (TCGv_i64)0x0;
LAB_0099a613:
        tcg_gen_op2_mips64el
                  (tcg_ctx,TVar7,(TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[reg]),
                   (TCGArg)pTVar4);
      }
      else if (tcg_ctx->cpu_gpr[reg] != tcg_ctx->cpu_mmr[rs]) {
        pTVar4 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_mmr[rs]);
        TVar7 = INDEX_op_mov_i64;
        goto LAB_0099a613;
      }
      if (rt != 0) {
        if (reg == rt) {
          return;
        }
        pTVar4 = tcg_ctx->cpu_mmr[reg];
        pTVar10 = tcg_ctx->cpu_mmr[rt];
        goto LAB_0099a697;
      }
      pTVar4 = tcg_ctx->cpu_mmr[reg];
    }
    else {
      if ((uVar5 != 0x1b) || ((uVar1 & 0x3e00000) != 0)) goto switchD_00999f53_caseD_70000002;
      if (reg == 0) {
        return;
      }
      tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      if (rt != 0) {
        pTVar2 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
        pTVar10 = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
        pTVar3 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
        pTVar4 = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx);
        tcg_gen_andi_i64_mips64el(tcg_ctx,pTVar10,tcg_ctx->cpu_gpr[rt],0xffff);
        tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)pTVar3,0);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar10,pTVar10,0x10);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar10,pTVar10,0x10);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar10,pTVar10,0x10);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        if (tcg_ctx->cpu_gpr[reg] != pTVar4) {
          tcg_gen_op2_mips64el
                    (tcg_ctx,INDEX_op_mov_i64,
                     (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[reg]),(TCGArg)pTVar3
                    );
        }
        tcg_gen_andi_i64_mips64el(tcg_ctx,pTVar10,tcg_ctx->cpu_mmr[rt],0xffff);
        tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)pTVar3,0);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar10,pTVar10,0x10);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar10,pTVar10,0x10);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar10,pTVar10,0x10);
        tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)pTVar3,(TCGArg)pTVar2,(TCGArg)pTVar3);
        if (tcg_ctx->cpu_mmr[reg] != pTVar4) {
          tcg_gen_op2_mips64el
                    (tcg_ctx,INDEX_op_mov_i64,
                     (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_mmr[reg]),(TCGArg)pTVar3
                    );
        }
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar10 + (long)tcg_ctx));
        pTVar2 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
        goto LAB_0099a5ad;
      }
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_movi_i64,
                 (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[reg]),0);
      pTVar4 = tcg_ctx->cpu_mmr[reg];
    }
  }
  pTVar4 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)pTVar4);
  TVar7 = INDEX_op_movi_i64;
  pTVar10 = (TCGv_i64)0x0;
LAB_0099a6d0:
  tcg_gen_op2_mips64el(tcg_ctx,TVar7,(TCGArg)pTVar4,(TCGArg)pTVar10);
  return;
}

Assistant:

static void decode_mmi(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opc = MASK_MMI(ctx->opcode);
    int rs = extract32(ctx->opcode, 21, 5);
    int rt = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (opc) {
    case MMI_OPC_CLASS_MMI0:
        decode_mmi0(env, ctx);
        break;
    case MMI_OPC_CLASS_MMI1:
        decode_mmi1(env, ctx);
        break;
    case MMI_OPC_CLASS_MMI2:
        decode_mmi2(env, ctx);
        break;
    case MMI_OPC_CLASS_MMI3:
        decode_mmi3(env, ctx);
        break;
    case MMI_OPC_MULT1:
    case MMI_OPC_MULTU1:
    case MMI_OPC_MADD:
    case MMI_OPC_MADDU:
    case MMI_OPC_MADD1:
    case MMI_OPC_MADDU1:
        gen_mul_txx9(ctx, opc, rd, rs, rt);
        break;
    case MMI_OPC_DIV1:
    case MMI_OPC_DIVU1:
        gen_div1_tx79(ctx, opc, rs, rt);
        break;
    case MMI_OPC_MTLO1:
    case MMI_OPC_MTHI1:
        gen_HILO1_tx79(ctx, opc, rs);
        break;
    case MMI_OPC_MFLO1:
    case MMI_OPC_MFHI1:
        gen_HILO1_tx79(ctx, opc, rd);
        break;
    case MMI_OPC_PLZCW:         /* TODO: MMI_OPC_PLZCW */
    case MMI_OPC_PMFHL:         /* TODO: MMI_OPC_PMFHL */
    case MMI_OPC_PMTHL:         /* TODO: MMI_OPC_PMTHL */
    case MMI_OPC_PSLLH:         /* TODO: MMI_OPC_PSLLH */
    case MMI_OPC_PSRLH:         /* TODO: MMI_OPC_PSRLH */
    case MMI_OPC_PSRAH:         /* TODO: MMI_OPC_PSRAH */
    case MMI_OPC_PSLLW:         /* TODO: MMI_OPC_PSLLW */
    case MMI_OPC_PSRLW:         /* TODO: MMI_OPC_PSRLW */
    case MMI_OPC_PSRAW:         /* TODO: MMI_OPC_PSRAW */
        generate_exception_end(ctx, EXCP_RI);    /* TODO: MMI_OPC_CLASS_MMI */
        break;
    default:
        MIPS_INVAL("TX79 MMI class");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}